

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::GridDataType2::AddValue(GridDataType2 *this,KFLOAT32 V)

{
  undefined1 *puVar1;
  iterator __position;
  float local_4;
  
  puVar1 = &(this->super_GridData).field_0xc;
  *(short *)puVar1 = *(short *)puVar1 + 1;
  __position._M_current =
       (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)&this->m_vf32Values,__position,&local_4);
  }
  else {
    *__position._M_current = (float)V;
    (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void GridDataType2:: AddValue( KFLOAT32 V )
{
    ++m_ui16NumValues;
    m_vf32Values.push_back( V );
}